

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O2

int ixmlNamedNodeMap_addToNamedNodeMap(IXML_NamedNodeMap **nnMap,IXML_Node_conflict *add)

{
  IXML_NamedNodeMap *pIVar1;
  _IXML_NamedNodeMap *p_Var2;
  IXML_NamedNodeMap *pIVar3;
  
  if (add == (IXML_Node_conflict *)0x0) {
    return 0;
  }
  pIVar3 = *nnMap;
  if (pIVar3 == (IXML_NamedNodeMap *)0x0) {
    pIVar3 = (IXML_NamedNodeMap *)calloc(1,0x10);
    *nnMap = pIVar3;
    if (pIVar3 != (IXML_NamedNodeMap *)0x0) goto LAB_00107358;
  }
  else {
    p_Var2 = pIVar3;
    if (pIVar3->nodeItem == (IXML_Node_conflict *)0x0) {
LAB_00107358:
      pIVar3->nodeItem = add;
      return 0;
    }
    while (pIVar1 = p_Var2, pIVar1 != (IXML_NamedNodeMap *)0x0) {
      pIVar3 = pIVar1;
      p_Var2 = pIVar1->next;
    }
    p_Var2 = (_IXML_NamedNodeMap *)malloc(0x10);
    if (p_Var2 != (_IXML_NamedNodeMap *)0x0) {
      pIVar3->next = p_Var2;
      p_Var2->nodeItem = add;
      p_Var2->next = (_IXML_NamedNodeMap *)0x0;
      return 0;
    }
  }
  return 0x66;
}

Assistant:

int ixmlNamedNodeMap_addToNamedNodeMap(
	IXML_NamedNodeMap **nnMap, IXML_Node *add)
{
	IXML_NamedNodeMap *traverse = NULL;
	IXML_NamedNodeMap *p = NULL;
	IXML_NamedNodeMap *newItem = NULL;

	if (add == NULL) {
		return IXML_SUCCESS;
	}

	if (*nnMap == NULL) {
		/* nodelist is empty */
		*nnMap = (IXML_NamedNodeMap *)malloc(sizeof(IXML_NamedNodeMap));
		if (*nnMap == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
		ixmlNamedNodeMap_init(*nnMap);
	}
	if ((*nnMap)->nodeItem == NULL) {
		(*nnMap)->nodeItem = add;
	} else {
		traverse = *nnMap;
		p = traverse;
		while (traverse != NULL) {
			p = traverse;
			traverse = traverse->next;
		}
		newItem =
			(IXML_NamedNodeMap *)malloc(sizeof(IXML_NamedNodeMap));
		if (newItem == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
		p->next = newItem;
		newItem->nodeItem = add;
		newItem->next = NULL;
	}

	return IXML_SUCCESS;
}